

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int c,int type)

{
  Mat m;
  Mat local_70;
  
  (*this->_vptr_ModelBin[2])(&local_70,this,(ulong)(uint)(h * w * c),type);
  if ((local_70.data == (void *)0x0) || ((long)local_70.c * local_70.cstep == 0)) {
    Mat::Mat(__return_storage_ptr__,&local_70);
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_70,w,h,c,(Allocator *)0x0);
  }
  Mat::~Mat(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}